

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsByFrequency
          (MidiMessage *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping,
          int program)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> semimap;
  allocator_type local_41;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&local_40,
             (long)(mapping->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(mapping->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,&local_41);
  ppVar1 = (mapping->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (mapping->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppVar2 - (long)ppVar1) >> 4)) {
    lVar4 = 0;
    lVar5 = 0;
    ppVar3 = local_40.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      *(undefined4 *)((long)&ppVar3->first + lVar4) = *(undefined4 *)((long)&ppVar1->first + lVar4);
      dVar6 = *(double *)((long)&ppVar1->second + lVar4);
      uVar8 = 0;
      if (1.0 <= dVar6) {
        dVar6 = log2(dVar6 / 440.0);
        dVar7 = dVar6 * 12.0 + 69.0;
        dVar6 = 0.0;
        if (0.0 <= dVar7) {
          dVar6 = dVar7;
        }
        uVar8 = ~-(ulong)(dVar7 < 128.0) & 0x405fc00000000000 |
                (ulong)dVar6 & -(ulong)(dVar7 < 128.0);
        ppVar1 = (mapping->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (mapping->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        ppVar3 = local_40.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      *(ulong *)((long)&ppVar3->second + lVar4) = uVar8;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < (int)((ulong)((long)ppVar2 - (long)ppVar1) >> 4));
  }
  makeMts2_KeyTuningsBySemitone(this,&local_40,program);
  if (local_40.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsByFrequency(std::vector<std::pair<int, double>>& mapping, int program) {
	std::vector<std::pair<int, double>> semimap(mapping.size());
	for (int i=0; i<(int)mapping.size(); i++) {
		semimap[i].first = mapping[i].first;
		semimap[i].second = MidiMessage::frequencyToSemitones(mapping[i].second);
	}
	this->makeMts2_KeyTuningsBySemitone(semimap, program);
}